

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFVerifier.cpp
# Opt level: O3

uint __thiscall
llvm::DWARFVerifier::verifyDebugInfoAttribute
          (DWARFVerifier *this,DWARFDie *Die,DWARFAttribute *AttrValue)

{
  Attribute Attr;
  DWARFObject *pDVar1;
  void *pvVar2;
  char *pcVar3;
  Child LHS;
  Child CVar4;
  Child CVar5;
  ArrayRef<unsigned_char> D;
  bool bVar6;
  Tag TVar7;
  int iVar8;
  undefined4 extraout_var;
  DWARFAbbreviationDeclaration *pDVar9;
  undefined4 extraout_var_00;
  DWARFDebugLoc *this_00;
  LocationList *pLVar10;
  raw_ostream *prVar11;
  Tag TVar12;
  ulong uVar13;
  undefined1 LHSKind;
  DWARFDebugInfoEntry *pDVar14;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  void *__buf_02;
  char *pcVar15;
  uint Tag;
  NodeKind in_R8B;
  long lVar16;
  Child CVar17;
  Child CVar18;
  DWARFDie DVar19;
  Optional<unsigned_long> OVar20;
  StringRef Fmt;
  ArrayRef<unsigned_char> D_00;
  Twine local_1a0;
  Twine local_188;
  StringRef local_170;
  StringRef local_160;
  StringRef local_150;
  Twine local_140;
  undefined1 local_128 [8];
  anon_class_24_3_98b65f3c ReportError;
  Optional<unsigned_long> SectionOffset;
  Child CStack_f8;
  anon_class_24_3_3ca02edf VerifyLocationExpr;
  size_t local_d8;
  void *local_d0;
  long local_c0;
  Child local_a0;
  undefined8 uStack_98;
  NodeKind local_90;
  char cStack_8f;
  undefined6 uStack_8e;
  Child local_88;
  undefined4 uStack_80;
  undefined4 uStack_7c;
  NodeKind local_78;
  char cStack_77;
  undefined6 uStack_76;
  Child local_70;
  undefined4 uStack_68;
  undefined4 uStack_64;
  NodeKind local_60;
  char cStack_5f;
  undefined6 uStack_5e;
  undefined1 auStack_58 [8];
  Optional<llvm::ArrayRef<unsigned_char>_> Expr;
  uint local_34;
  uint NumErrors;
  
  local_128 = (undefined1  [8])&local_34;
  local_34 = 0;
  pDVar1 = (this->DCtx->DObj)._M_t.
           super___uniq_ptr_impl<const_llvm::DWARFObject,_std::default_delete<const_llvm::DWARFObject>_>
           ._M_t.
           super__Tuple_impl<0UL,_const_llvm::DWARFObject_*,_std::default_delete<const_llvm::DWARFObject>_>
           .super__Head_base<0UL,_const_llvm::DWARFObject_*,_false>._M_head_impl;
  Attr = AttrValue->Attr;
  ReportError.NumErrors = (uint *)this;
  ReportError.this = (DWARFVerifier *)Die;
  if (Attr < DW_AT_specification) {
    if (Attr == DW_AT_location) {
      VerifyLocationExpr.this = (DWARFVerifier *)local_128;
      CStack_f8 = (Child)Die;
      VerifyLocationExpr.Die = (DWARFDie *)this;
      DWARFFormValue::getAsBlock
                ((Optional<llvm::ArrayRef<unsigned_char>_> *)auStack_58,&AttrValue->Value);
      if (Expr.Storage.field_0.value.Length._0_1_ == '\x01') {
        D.Data._4_4_ = auStack_58._4_4_;
        D.Data._0_4_ = auStack_58._0_4_;
        D.Length._0_4_ = Expr.Storage.field_0._0_4_;
        D.Length._4_4_ = Expr.Storage.field_0._4_4_;
        verifyDebugInfoAttribute::anon_class_24_3_3ca02edf::operator()
                  ((anon_class_24_3_3ca02edf *)&CStack_f8,D);
        return local_34;
      }
      OVar20 = DWARFFormValue::getAsSectionOffset(&AttrValue->Value);
      if (((undefined1  [16])OVar20.Storage & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        return local_34;
      }
      this_00 = DWARFContext::getDebugLoc(this->DCtx);
      if (this_00 == (DWARFDebugLoc *)0x0) {
        return local_34;
      }
      pLVar10 = DWARFDebugLoc::getLocationListAtOffset(this_00,OVar20.Storage.field_0.value);
      if (pLVar10 == (LocationList *)0x0) {
        return local_34;
      }
      uVar13 = (ulong)(pLVar10->Entries).super_SmallVectorImpl<llvm::DWARFDebugLoc::Entry>.
                      super_SmallVectorTemplateBase<llvm::DWARFDebugLoc::Entry,_false>.
                      super_SmallVectorTemplateCommon<llvm::DWARFDebugLoc::Entry,_void>.
                      super_SmallVectorBase.Size;
      if (uVar13 == 0) {
        return local_34;
      }
      pvVar2 = (pLVar10->Entries).super_SmallVectorImpl<llvm::DWARFDebugLoc::Entry>.
               super_SmallVectorTemplateBase<llvm::DWARFDebugLoc::Entry,_false>.
               super_SmallVectorTemplateCommon<llvm::DWARFDebugLoc::Entry,_void>.
               super_SmallVectorBase.BeginX;
      lVar16 = 0;
      do {
        D_00.Length._0_4_ = *(undefined4 *)((long)pvVar2 + lVar16 + 0x18);
        D_00.Data = (uchar *)*(undefined8 *)((long)pvVar2 + lVar16 + 0x10);
        D_00.Length._4_4_ = 0;
        verifyDebugInfoAttribute::anon_class_24_3_3ca02edf::operator()
                  ((anon_class_24_3_3ca02edf *)&CStack_f8,D_00);
        lVar16 = lVar16 + 0x28;
      } while (uVar13 * 0x28 != lVar16);
      return local_34;
    }
    if (Attr != DW_AT_stmt_list) {
      if (Attr != 0x31) {
        return 0;
      }
      goto LAB_00b0985a;
    }
    OVar20 = DWARFFormValue::getAsSectionOffset(&AttrValue->Value);
    stack0xfffffffffffffef0 = OVar20.Storage._0_9_;
    if (((undefined1  [16])OVar20.Storage & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      iVar8 = (*pDVar1->_vptr_DWARFObject[0xf])(pDVar1);
      if (OVar20.Storage.field_0.value < *(ulong *)(CONCAT44(extraout_var_00,iVar8) + 8)) {
        return local_34;
      }
      Twine::Twine((Twine *)&local_88,"DW_AT_stmt_list offset is beyond .debug_line bounds: ");
      local_a0.twine = (Twine *)&PTR_anchor_00d783f8;
      uStack_98 = &ReportError.Die;
      Fmt.Length = 6;
      Fmt.Data = "{0:x8}";
      formatv_object<std::tuple<llvm::detail::provider_format_adapter<unsigned_long_&>_>_>::
      formatv_object((formatv_object<std::tuple<llvm::detail::provider_format_adapter<unsigned_long_&>_>_>
                      *)&CStack_f8,Fmt,
                     (tuple<llvm::detail::provider_format_adapter<unsigned_long_&>_> *)&local_a0);
      Twine::Twine((Twine *)&local_70,(formatv_object_base *)&CStack_f8);
      if ((local_78 == NullKind) || (local_60 == NullKind)) {
        auStack_58._0_4_ = _S_red;
        auStack_58._4_4_ = 0;
        Expr.Storage.field_0._0_4_ = 0;
        Expr.Storage.field_0._4_4_ = 0;
        Expr.Storage.field_0.value.Length._0_2_ = 0x100;
      }
      else if (local_78 == EmptyKind) {
        Expr.Storage.field_0.value.Length = CONCAT62(uStack_5e,CONCAT11(cStack_5f,local_60));
        auStack_58._0_4_ = local_70.decUI;
        auStack_58._4_4_ = local_70._4_4_;
        Expr.Storage.field_0._0_4_ = uStack_68;
        Expr.Storage.field_0._4_4_ = uStack_64;
      }
      else if (local_60 == EmptyKind) {
        Expr.Storage.field_0.value.Length = CONCAT62(uStack_76,CONCAT11(cStack_77,local_78));
        auStack_58._0_4_ = local_88.decUI;
        auStack_58._4_4_ = local_88._4_4_;
        Expr.Storage.field_0._0_4_ = uStack_80;
        Expr.Storage.field_0._4_4_ = uStack_7c;
      }
      else {
        CVar18._4_4_ = local_88._4_4_;
        CVar18.decUI = local_88.decUI;
        if (cStack_77 != '\x01') {
          local_78 = TwineKind;
          CVar18.twine = (Twine *)&local_88;
        }
        in_R8B = local_60;
        if (cStack_5f != '\x01') {
          in_R8B = TwineKind;
        }
        CVar5._4_4_ = local_70._4_4_;
        CVar5.decUI = local_70.decUI;
        CVar17.twine = (Twine *)&local_70;
        if (cStack_5f == '\x01') {
          CVar17 = CVar5;
        }
        Twine::Twine((Twine *)auStack_58,CVar18,local_78,CVar17,in_R8B);
      }
      local_34 = local_34 + 1;
      pcVar15 = (char *)0x0;
      prVar11 = WithColor::error((WithColor *)this->OS,(raw_ostream *)0xbd4a1c,(StringRef)ZEXT816(0)
                                 ,(bool)in_R8B);
      Twine::print((Twine *)auStack_58,prVar11);
      pcVar3 = prVar11->OutBufCur;
      if (pcVar3 < prVar11->OutBufEnd) {
        pcVar15 = pcVar3 + 1;
        prVar11->OutBufCur = pcVar15;
        *pcVar3 = '\n';
      }
      else {
        raw_ostream::write(prVar11,10,__buf_01,(size_t)pcVar15);
      }
      DWARFDie::dump(Die,this->OS,0,this->DumpOpts);
      prVar11 = this->OS;
      pcVar3 = prVar11->OutBufCur;
      if (pcVar3 < prVar11->OutBufEnd) {
        prVar11->OutBufCur = pcVar3 + 1;
        *pcVar3 = '\n';
      }
      else {
        raw_ostream::write(prVar11,10,__buf_02,(size_t)pcVar15);
      }
      if (local_d0 != (void *)0x0) {
        operator_delete(local_d0,local_c0 - (long)local_d0);
      }
      if (VerifyLocationExpr.this == (DWARFVerifier *)0x0) {
        return local_34;
      }
      operator_delete(VerifyLocationExpr.this,local_d8 - (long)VerifyLocationExpr.this);
      return local_34;
    }
    pcVar15 = "DIE has invalid DW_AT_stmt_list encoding:";
  }
  else {
    if (Attr == DW_AT_specification) {
LAB_00b0985a:
      DVar19 = DWARFDie::getAttributeValueAsReferencedDie(Die,Attr);
      if (DVar19.Die != (DWARFDebugInfoEntry *)0x0 && DVar19.U != (DWARFUnit *)0x0) {
        pDVar9 = DWARFDie::getAbbreviationDeclarationPtr(Die);
        if (pDVar9 == (DWARFAbbreviationDeclaration *)0x0) {
          TVar7 = DW_TAG_null;
        }
        else {
          TVar7 = pDVar9->Tag;
        }
        pDVar9 = (DVar19.Die)->AbbrevDecl;
        if (pDVar9 == (DWARFAbbreviationDeclaration *)0x0) {
          TVar12 = DW_TAG_null;
        }
        else {
          TVar12 = pDVar9->Tag;
        }
        if ((TVar7 != TVar12) &&
           ((TVar7 != DW_TAG_inlined_subroutine || (TVar12 != DW_TAG_subprogram)))) {
          if ((TVar12 != DW_TAG_member || TVar7 != DW_TAG_variable) &&
             (TVar7 != DW_TAG_GNU_call_site || TVar12 != DW_TAG_subprogram)) {
            local_170 = dwarf::TagString((uint)TVar7);
            Twine::Twine((Twine *)&local_a0,"DIE with tag ",&local_170);
            Twine::Twine((Twine *)&ReportError.Die," has ");
            operator+((Twine *)&local_70,(Twine *)&local_a0,(Twine *)&ReportError.Die);
            local_160 = dwarf::AttributeString((uint)Attr);
            Twine::Twine(&local_140,&local_160);
            operator+((Twine *)&local_88,(Twine *)&local_70,&local_140);
            Twine::Twine(&local_1a0," that points to DIE with incompatible tag ");
            operator+((Twine *)auStack_58,(Twine *)&local_88,&local_1a0);
            local_150 = dwarf::TagString((uint)TVar12);
            Twine::Twine(&local_188,&local_150);
            operator+((Twine *)&CStack_f8,(Twine *)auStack_58,&local_188);
            verifyDebugInfoAttribute::anon_class_24_3_98b65f3c::operator()
                      ((anon_class_24_3_98b65f3c *)local_128,(Twine *)&CStack_f8);
          }
        }
      }
      return local_34;
    }
    if (Attr == DW_AT_type) {
      DVar19 = DWARFDie::getAttributeValueAsReferencedDie(Die,DW_AT_type);
      pDVar14 = DVar19.Die;
      if (pDVar14 == (DWARFDebugInfoEntry *)0x0 || DVar19.U == (DWARFUnit *)0x0) {
        return local_34;
      }
      if (pDVar14->AbbrevDecl == (DWARFAbbreviationDeclaration *)0x0) {
        TVar7 = DW_TAG_null;
      }
      else {
        TVar7 = pDVar14->AbbrevDecl->Tag;
      }
      bVar6 = dwarf::isType(TVar7);
      if (bVar6) {
        return local_34;
      }
      join_0x00000010_0x00000000_ = dwarf::AttributeString(0x49);
      Twine::Twine((Twine *)&local_88,"DIE has ",(StringRef *)&ReportError.Die);
      Twine::Twine((Twine *)&local_70," with incompatible tag ");
      if ((local_78 == NullKind) || (local_60 == NullKind)) {
        auStack_58._0_4_ = _S_red;
        auStack_58._4_4_ = 0;
        Expr.Storage.field_0._0_4_ = 0;
        Expr.Storage.field_0._4_4_ = 0;
        Expr.Storage.field_0.value.Length._0_2_ = 0x100;
      }
      else if (local_78 == EmptyKind) {
        Expr.Storage.field_0.value.Length = CONCAT62(uStack_5e,CONCAT11(cStack_5f,local_60));
        auStack_58._0_4_ = local_70.decUI;
        auStack_58._4_4_ = local_70._4_4_;
        Expr.Storage.field_0._0_4_ = uStack_68;
        Expr.Storage.field_0._4_4_ = uStack_64;
      }
      else if (local_60 == EmptyKind) {
        Expr.Storage.field_0.value.Length = CONCAT62(uStack_76,CONCAT11(cStack_77,local_78));
        auStack_58._0_4_ = local_88.decUI;
        auStack_58._4_4_ = local_88._4_4_;
        Expr.Storage.field_0._0_4_ = uStack_80;
        Expr.Storage.field_0._4_4_ = uStack_7c;
      }
      else {
        CVar17._4_4_ = local_88._4_4_;
        CVar17.decUI = local_88.decUI;
        if (cStack_77 != '\x01') {
          local_78 = TwineKind;
          CVar17.twine = (Twine *)&local_88;
        }
        in_R8B = local_60;
        if (cStack_5f != '\x01') {
          in_R8B = TwineKind;
        }
        CVar4._4_4_ = local_70._4_4_;
        CVar4.decUI = local_70.decUI;
        CVar18.twine = (Twine *)&local_70;
        if (cStack_5f == '\x01') {
          CVar18 = CVar4;
        }
        Twine::Twine((Twine *)auStack_58,CVar17,local_78,CVar18,in_R8B);
      }
      if (pDVar14->AbbrevDecl == (DWARFAbbreviationDeclaration *)0x0) {
        Tag = 0;
      }
      else {
        Tag = (uint)pDVar14->AbbrevDecl->Tag;
      }
      local_140._0_16_ = dwarf::TagString(Tag);
      Twine::Twine((Twine *)&local_a0,(StringRef *)&local_140);
      if ((Expr.Storage.field_0.value.Length._0_1_ == '\0') || (local_90 == NullKind)) {
        CStack_f8.twine = (Twine *)0x0;
        VerifyLocationExpr.Die = (DWARFDie *)0x0;
        VerifyLocationExpr.this = (DWARFVerifier *)CONCAT62(VerifyLocationExpr.this._2_6_,0x100);
      }
      else {
        if (Expr.Storage.field_0.value.Length._0_1_ == '\x01') {
          VerifyLocationExpr.this =
               (DWARFVerifier *)CONCAT62(uStack_8e,CONCAT11(cStack_8f,local_90));
        }
        else {
          if (local_90 != EmptyKind) {
            LHS._4_4_ = auStack_58._4_4_;
            LHS.decUI = auStack_58._0_4_;
            LHSKind = Expr.Storage.field_0.value.Length._0_1_;
            if (Expr.Storage.field_0.value.Length._1_1_ != '\x01') {
              LHS.twine = (Twine *)auStack_58;
              LHSKind = TwineKind;
            }
            in_R8B = local_90;
            if (cStack_8f != '\x01') {
              in_R8B = TwineKind;
              local_a0.twine = (Twine *)&local_a0;
            }
            Twine::Twine((Twine *)&CStack_f8,LHS,LHSKind,local_a0,in_R8B);
            goto LAB_00b09e5d;
          }
          VerifyLocationExpr.this = (DWARFVerifier *)Expr.Storage.field_0.value.Length;
          local_a0.decUI = auStack_58._0_4_;
          local_a0._4_4_ = auStack_58._4_4_;
          uStack_98._0_4_ = Expr.Storage.field_0._0_4_;
          uStack_98._4_4_ = Expr.Storage.field_0._4_4_;
        }
        CStack_f8._4_4_ = local_a0._4_4_;
        CStack_f8.decUI = local_a0.decUI;
        VerifyLocationExpr.Die = (DWARFDie *)CONCAT44(uStack_98._4_4_,(undefined4)uStack_98);
      }
LAB_00b09e5d:
      local_34 = local_34 + 1;
      pcVar15 = (char *)0x0;
      prVar11 = WithColor::error((WithColor *)this->OS,(raw_ostream *)0xbd4a1c,(StringRef)ZEXT816(0)
                                 ,(bool)in_R8B);
      goto LAB_00b09aa6;
    }
    if (Attr != DW_AT_ranges) {
      return 0;
    }
    OVar20 = DWARFFormValue::getAsSectionOffset(&AttrValue->Value);
    if (((undefined1  [16])OVar20.Storage & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      pcVar15 = "DIE has invalid DW_AT_ranges encoding:";
    }
    else {
      iVar8 = (*pDVar1->_vptr_DWARFObject[0x12])(pDVar1);
      if (OVar20.Storage.field_0.value < *(ulong *)(CONCAT44(extraout_var,iVar8) + 8)) {
        return local_34;
      }
      pcVar15 = "DW_AT_ranges offset is beyond .debug_ranges bounds:";
    }
  }
  Twine::Twine((Twine *)&CStack_f8,pcVar15);
  local_34 = local_34 + 1;
  pcVar15 = (char *)0x0;
  prVar11 = WithColor::error((WithColor *)this->OS,(raw_ostream *)0xbd4a1c,(StringRef)ZEXT816(0),
                             (bool)in_R8B);
LAB_00b09aa6:
  Twine::print((Twine *)&CStack_f8,prVar11);
  pcVar3 = prVar11->OutBufCur;
  if (pcVar3 < prVar11->OutBufEnd) {
    pcVar15 = pcVar3 + 1;
    prVar11->OutBufCur = pcVar15;
    *pcVar3 = '\n';
  }
  else {
    raw_ostream::write(prVar11,10,__buf,(size_t)pcVar15);
  }
  DWARFDie::dump(Die,this->OS,0,this->DumpOpts);
  prVar11 = this->OS;
  pcVar3 = prVar11->OutBufCur;
  if (pcVar3 < prVar11->OutBufEnd) {
    prVar11->OutBufCur = pcVar3 + 1;
    *pcVar3 = '\n';
    return local_34;
  }
  raw_ostream::write(prVar11,10,__buf_00,(size_t)pcVar15);
  return local_34;
}

Assistant:

unsigned DWARFVerifier::verifyDebugInfoAttribute(const DWARFDie &Die,
                                                 DWARFAttribute &AttrValue) {
  unsigned NumErrors = 0;
  auto ReportError = [&](const Twine &TitleMsg) {
    ++NumErrors;
    error() << TitleMsg << '\n';
    dump(Die) << '\n';
  };

  const DWARFObject &DObj = DCtx.getDWARFObj();
  const auto Attr = AttrValue.Attr;
  switch (Attr) {
  case DW_AT_ranges:
    // Make sure the offset in the DW_AT_ranges attribute is valid.
    if (auto SectionOffset = AttrValue.Value.getAsSectionOffset()) {
      if (*SectionOffset >= DObj.getRangesSection().Data.size())
        ReportError("DW_AT_ranges offset is beyond .debug_ranges bounds:");
      break;
    }
    ReportError("DIE has invalid DW_AT_ranges encoding:");
    break;
  case DW_AT_stmt_list:
    // Make sure the offset in the DW_AT_stmt_list attribute is valid.
    if (auto SectionOffset = AttrValue.Value.getAsSectionOffset()) {
      if (*SectionOffset >= DObj.getLineSection().Data.size())
        ReportError("DW_AT_stmt_list offset is beyond .debug_line bounds: " +
                    llvm::formatv("{0:x8}", *SectionOffset));
      break;
    }
    ReportError("DIE has invalid DW_AT_stmt_list encoding:");
    break;
  case DW_AT_location: {
    auto VerifyLocationExpr = [&](ArrayRef<uint8_t> D) {
      DWARFUnit *U = Die.getDwarfUnit();
      DataExtractor Data(toStringRef(D), DCtx.isLittleEndian(), 0);
      DWARFExpression Expression(Data, U->getVersion(),
                                 U->getAddressByteSize());
      bool Error = llvm::any_of(Expression, [](DWARFExpression::Operation &Op) {
        return Op.isError();
      });
      if (Error || !Expression.verify(U))
        ReportError("DIE contains invalid DWARF expression:");
    };
    if (Optional<ArrayRef<uint8_t>> Expr = AttrValue.Value.getAsBlock()) {
      // Verify inlined location.
      VerifyLocationExpr(*Expr);
    } else if (auto LocOffset = AttrValue.Value.getAsSectionOffset()) {
      // Verify location list.
      if (auto DebugLoc = DCtx.getDebugLoc())
        if (auto LocList = DebugLoc->getLocationListAtOffset(*LocOffset))
          for (const auto &Entry : LocList->Entries)
            VerifyLocationExpr(Entry.Loc);
    }
    break;
  }
  case DW_AT_specification:
  case DW_AT_abstract_origin: {
    if (auto ReferencedDie = Die.getAttributeValueAsReferencedDie(Attr)) {
      auto DieTag = Die.getTag();
      auto RefTag = ReferencedDie.getTag();
      if (DieTag == RefTag)
        break;
      if (DieTag == DW_TAG_inlined_subroutine && RefTag == DW_TAG_subprogram)
        break;
      if (DieTag == DW_TAG_variable && RefTag == DW_TAG_member)
        break;
      // This might be reference to a function declaration.
      if (DieTag == DW_TAG_GNU_call_site && RefTag == DW_TAG_subprogram)
        break;
      ReportError("DIE with tag " + TagString(DieTag) + " has " +
                  AttributeString(Attr) +
                  " that points to DIE with "
                  "incompatible tag " +
                  TagString(RefTag));
    }
    break;
  }
  case DW_AT_type: {
    DWARFDie TypeDie = Die.getAttributeValueAsReferencedDie(DW_AT_type);
    if (TypeDie && !isType(TypeDie.getTag())) {
      ReportError("DIE has " + AttributeString(Attr) +
                  " with incompatible tag " + TagString(TypeDie.getTag()));
    }
    break;
  }
  default:
    break;
  }
  return NumErrors;
}